

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  FileMetaData *pFVar5;
  long in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<leveldb::FileMetaData_*>,_bool> pVar6;
  FileMetaData *f;
  int level_2;
  size_t i_1;
  uint64_t number;
  int level_1;
  pair<int,_unsigned_long> *deleted_file_set_kvp;
  iterator __end2;
  iterator __begin2;
  DeletedFileSet *__range2;
  int level;
  size_t i;
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  *in_stack_ffffffffffffff28;
  _Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *in_stack_ffffffffffffff30;
  _Rb_tree_const_iterator<leveldb::FileMetaData_*> in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  Slice *in_stack_ffffffffffffff68;
  FileMetaData *this_00;
  FileMetaData *__n;
  _Self local_68;
  _Self local_60;
  long local_58;
  Slice local_50;
  string local_40 [36];
  int local_1c;
  ulong local_18;
  long local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  while( true ) {
    uVar1 = local_18;
    sVar3 = std::
            vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                    *)(local_10 + 0x48));
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                           *)(local_10 + 0x48),local_18);
    local_1c = pvVar4->first;
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)(local_10 + 0x48),local_18);
    local_50 = InternalKey::Encode((InternalKey *)0x12e456);
    Slice::ToString_abi_cxx11_(in_stack_ffffffffffffff68);
    std::__cxx11::string::operator=((string *)(*in_RDI + 0x170 + (long)local_1c * 0x20),local_40);
    std::__cxx11::string::~string(local_40);
    local_18 = local_18 + 1;
  }
  local_58 = local_10 + 0x60;
  local_60._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_68._M_node =
       (_Base_ptr)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff28);
  while( true ) {
    bVar2 = std::operator!=(&local_60,&local_68);
    if (!bVar2) break;
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)0x12e523);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
               (value_type_conflict1 *)in_stack_ffffffffffffff48._M_node);
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++
              (in_stack_ffffffffffffff30);
  }
  this_00 = (FileMetaData *)0x0;
  while( true ) {
    __n = this_00;
    pFVar5 = (FileMetaData *)
             std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)(local_10 + 0x90));
    if (pFVar5 <= this_00) break;
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)(local_10 + 0x90),(size_type)__n);
    pFVar5 = (FileMetaData *)operator_new(0x58);
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)(local_10 + 0x90),(size_type)__n);
    FileMetaData::FileMetaData(this_00,pFVar5);
    pFVar5->refs = 1;
    pFVar5->allowed_seeks = (int)(pFVar5->file_size >> 0xe);
    if (pFVar5->allowed_seeks < 100) {
      pFVar5->allowed_seeks = 100;
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               this_00,(key_type *)pFVar5);
    pVar6 = std::
            set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
            ::insert((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
                      *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
                     (value_type *)in_stack_ffffffffffffff48._M_node);
    in_stack_ffffffffffffff48 = pVar6.first._M_node;
    in_stack_ffffffffffffff50 = pVar6.second;
    this_00 = (FileMetaData *)((long)&__n->refs + 1);
  }
  return;
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }